

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O2

uint64_t __thiscall
tonk::Connection::tonk_from_local_time_16(Connection *this,uint16_t networkTimestamp16)

{
  uint64_t uVar1;
  Counter16 local_2;
  
  uVar1 = TimeSynchronizer::FromLocalTime16
                    (&this->TimeSync,(this->LastTickUsec).super___atomic_base<unsigned_long>._M_i,
                     &local_2);
  return uVar1;
}

Assistant:

uint64_t Connection::tonk_from_local_time_16(uint16_t networkTimestamp16)
{
    // WARNING: This function is not called on the Connection green thread,
    // so accessing members here is not threadsafe by default.

    // Grab a recent timestamp as a basis for truncated timestamp decompression
    const uint64_t localUsec = LastTickUsec;

    TONK_DEBUG_ASSERT(SelfRefCount.DoesAppHoldReference());
    return TimeSync.FromLocalTime16(localUsec, networkTimestamp16);
}